

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign_x86.cpp
# Opt level: O2

int __thiscall
ncnn::ROIAlign_x86::forward
          (ROIAlign_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  undefined8 uVar1;
  Mat *this_00;
  Mat *this_01;
  _func_int **pp_Var2;
  undefined1 auVar3 [16];
  void *pvVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int _c;
  int iVar9;
  _func_int *p_Var10;
  float *pfVar11;
  void *pvVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar26;
  undefined1 auVar25 [16];
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [16];
  float fVar32;
  void *local_160;
  vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_> pre_calc;
  undefined8 local_b8;
  Mat local_90;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  this_00 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  iVar9 = this_00->w;
  iVar5 = this_00->h;
  _c = this_00->c;
  this_01 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_01,*(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86[-3]),
              *(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86[-3]),_c,this_00->elemsize,
              opt->blob_allocator);
  iVar18 = -100;
  if ((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) {
    p_Var10 = this->_vptr_ROIAlign_x86[-3];
    fVar27 = *(float *)(&this->field_0xd8 + (long)p_Var10);
    auVar31._0_8_ = *this_00[1].data;
    uVar1 = *(undefined8 *)((long)this_00[1].data + 8);
    fVar23 = (float)auVar31._0_8_ * fVar27;
    fVar26 = (float)((ulong)auVar31._0_8_ >> 0x20) * fVar27;
    auVar25._0_8_ = CONCAT44(fVar26,fVar23);
    auVar25._8_4_ = fVar27 * 0.0;
    auVar25._12_4_ = fVar27 * 0.0;
    auVar31._0_8_ =
         CONCAT44((float)((ulong)uVar1 >> 0x20) * fVar27 - fVar26,(float)uVar1 * fVar27 - fVar23);
    auVar31._8_4_ = fVar27 * 0.0 - auVar25._8_4_;
    auVar31._12_4_ = fVar27 * 0.0 - auVar25._12_4_;
    if ((&this->field_0xe0)[(long)p_Var10] == '\x01') {
      local_b8 = CONCAT44(fVar26 + -0.5,fVar23 + -0.5);
    }
    else {
      auVar31 = maxps(auVar31,_DAT_002d9c90);
      local_b8 = auVar25._0_8_;
    }
    iVar18 = (int)*(undefined8 *)(&this->field_0xd0 + (long)p_Var10);
    iVar8 = (int)((ulong)*(undefined8 *)(&this->field_0xd0 + (long)p_Var10) >> 0x20);
    auVar3._4_4_ = (float)iVar8;
    auVar3._0_4_ = (float)iVar18;
    auVar3._8_8_ = 0;
    auVar25 = rcpps(auVar25,auVar3);
    fVar26 = (float)((ulong)auVar31._0_8_ >> 0x20);
    fVar27 = (float)auVar31._0_8_ * auVar25._0_4_;
    fVar23 = fVar26 * auVar25._4_4_;
    fVar27 = ((float)auVar31._0_8_ - (float)iVar18 * fVar27) * auVar25._0_4_ + fVar27;
    fVar23 = (fVar26 - (float)iVar8 * fVar23) * auVar25._4_4_ + fVar23;
    if (*(int *)(&this->field_0xe4 + (long)p_Var10) == 1) {
      if (*(int *)(&this->field_0xdc + (long)p_Var10) < 1) {
        fVar26 = ceilf(fVar23);
        fVar20 = ceilf(fVar27);
      }
      else {
        fVar20 = (float)*(int *)(&this->field_0xdc + (long)p_Var10);
        fVar26 = fVar20;
      }
      iVar7 = (int)fVar26;
      iVar6 = (int)fVar20;
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar8 * (long)iVar7 * (long)iVar18 * (long)iVar6,
                 (allocator_type *)&local_90);
      iVar18 = 1;
      if (1 < iVar6 * iVar7) {
        iVar18 = iVar6 * iVar7;
      }
      detectron2_pre_calc_for_bilinear_interpolate<float>
                (iVar5,iVar9,*(int *)(&this->field_0xd4 + (long)this->_vptr_ROIAlign_x86[-3]),
                 *(int *)(&this->field_0xd0 + (long)this->_vptr_ROIAlign_x86[-3]),iVar7,iVar6,
                 local_b8._4_4_,(float)local_b8,fVar23,fVar27,iVar7,iVar6,&pre_calc);
      iVar5 = 0;
      iVar9 = 0;
      if (iVar6 < 1) {
        iVar6 = iVar9;
      }
      if (iVar7 < 1) {
        iVar7 = iVar9;
      }
      if (_c < 1) {
        _c = iVar9;
      }
      for (; iVar5 != _c; iVar5 = iVar5 + 1) {
        Mat::channel(&local_90,this_00,iVar5);
        pvVar4 = local_90.data;
        Mat::~Mat(&local_90);
        Mat::channel(&local_90,this_01,iVar5);
        pvVar12 = local_90.data;
        Mat::~Mat(&local_90);
        pp_Var2 = this->_vptr_ROIAlign_x86;
        p_Var10 = pp_Var2[-3];
        iVar9 = 0;
        for (iVar8 = 0; iVar8 < *(int *)(&this->field_0xd4 + (long)p_Var10); iVar8 = iVar8 + 1) {
          for (lVar13 = 0; lVar13 < *(int *)(&this->field_0xd0 + (long)p_Var10); lVar13 = lVar13 + 1
              ) {
            fVar27 = 0.0;
            iVar14 = iVar9;
            for (iVar15 = 0; iVar15 != iVar7; iVar15 = iVar15 + 1) {
              pfVar11 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar14].w1;
              iVar17 = iVar6;
              while (bVar19 = iVar17 != 0, iVar17 = iVar17 + -1, bVar19) {
                fVar27 = fVar27 + *(float *)((long)pvVar4 + (long)(int)pfVar11[-1] * 4) * pfVar11[3]
                                  + *(float *)((long)pvVar4 + (long)(int)pfVar11[-3] * 4) *
                                    pfVar11[1] +
                                  *(float *)((long)pvVar4 + (long)(int)pfVar11[-2] * 4) * pfVar11[2]
                                  + *(float *)((long)pvVar4 +
                                              (long)((PreCalc<float> *)(pfVar11 + -4))->pos1 * 4) *
                                    *pfVar11;
                pfVar11 = pfVar11 + 8;
              }
              iVar14 = iVar14 + iVar6;
            }
            iVar9 = iVar9 + iVar7 * iVar6;
            *(float *)((long)pvVar12 + lVar13 * 4) = fVar27 * (1.0 / (float)iVar18);
            p_Var10 = pp_Var2[-3];
          }
          pvVar12 = (void *)((long)pvVar12 + (long)*(int *)(&this->field_0xd0 + (long)p_Var10) * 4);
        }
      }
    }
    else {
      if (*(int *)(&this->field_0xe4 + (long)p_Var10) != 0) {
        return 0;
      }
      if (*(int *)(&this->field_0xdc + (long)p_Var10) < 1) {
        fVar20 = ceilf(fVar27);
        fVar26 = ceilf(fVar23);
      }
      else {
        fVar20 = (float)*(int *)(&this->field_0xdc + (long)p_Var10);
        fVar26 = fVar20;
      }
      std::vector<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::vector
                (&pre_calc,(long)iVar8 * (long)(int)fVar26 * (long)iVar18 * (long)(int)fVar20,
                 (allocator_type *)&local_90);
      p_Var10 = this->_vptr_ROIAlign_x86[-3];
      local_48 = local_b8._4_4_;
      fStack_44 = local_b8._4_4_;
      fStack_40 = local_b8._4_4_;
      fStack_3c = local_b8._4_4_;
      original_pre_calc_for_bilinear_interpolate<float>
                (iVar5,iVar9,*(int *)(&this->field_0xd4 + (long)p_Var10),
                 *(int *)(&this->field_0xd0 + (long)p_Var10),local_b8._4_4_,(float)local_b8,fVar23,
                 fVar27,*(int *)(&this->field_0xdc + (long)p_Var10),&pre_calc);
      fVar26 = (float)iVar5;
      fVar20 = (float)iVar9;
      if (_c < 1) {
        _c = 0;
      }
      for (iVar9 = 0; iVar9 != _c; iVar9 = iVar9 + 1) {
        Mat::channel(&local_90,this_00,iVar9);
        pvVar12 = local_90.data;
        Mat::~Mat(&local_90);
        Mat::channel(&local_90,this_01,iVar9);
        local_160 = local_90.data;
        Mat::~Mat(&local_90);
        pp_Var2 = this->_vptr_ROIAlign_x86;
        p_Var10 = pp_Var2[-3];
        iVar18 = 0;
        iVar5 = 0;
        while (iVar5 < *(int *)(&this->field_0xd4 + (long)p_Var10)) {
          fVar28 = (float)iVar5 * fVar23 + local_48;
          iVar5 = iVar5 + 1;
          fVar29 = (float)iVar5 * fVar23 + local_48;
          if (fVar28 <= 0.0) {
            fVar28 = 0.0;
          }
          if (fVar26 <= fVar28) {
            fVar28 = fVar26;
          }
          if (fVar29 <= 0.0) {
            fVar29 = 0.0;
          }
          if (fVar26 <= fVar29) {
            fVar29 = fVar26;
          }
          fVar21 = ceilf(fVar29 - fVar28);
          lVar13 = 0;
          while (lVar13 < *(int *)(&this->field_0xd0 + (long)p_Var10)) {
            fVar30 = (float)(int)lVar13 * fVar27 + (float)local_b8;
            fVar32 = (float)(int)(lVar13 + 1) * fVar27 + (float)local_b8;
            if (fVar30 <= 0.0) {
              fVar30 = 0.0;
            }
            if (fVar20 <= fVar30) {
              fVar30 = fVar20;
            }
            if (fVar32 <= 0.0) {
              fVar32 = 0.0;
            }
            if (fVar20 <= fVar32) {
              fVar32 = fVar20;
            }
            if (*(int *)(&this->field_0xdc + (long)p_Var10) < 1) {
              fVar24 = ceilf(fVar32 - fVar30);
              fVar22 = fVar21;
            }
            else {
              fVar24 = (float)*(int *)(&this->field_0xdc + (long)p_Var10);
              fVar22 = fVar24;
            }
            iVar6 = (int)fVar22;
            iVar7 = (int)fVar24;
            iVar14 = 0;
            iVar8 = 0;
            if (0 < iVar7) {
              iVar8 = iVar7;
            }
            iVar15 = 0;
            if (0 < iVar6) {
              iVar15 = iVar6;
            }
            fVar22 = 0.0;
            iVar17 = iVar18;
            for (; iVar14 != iVar15; iVar14 = iVar14 + 1) {
              pfVar11 = &pre_calc.
                         super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar17].w1;
              iVar16 = iVar8;
              while (bVar19 = iVar16 != 0, iVar16 = iVar16 + -1, bVar19) {
                fVar22 = fVar22 + *(float *)((long)pvVar12 + (long)(int)pfVar11[-1] * 4) *
                                  pfVar11[3] +
                                  *(float *)((long)pvVar12 + (long)(int)pfVar11[-3] * 4) *
                                  pfVar11[1] +
                                  *(float *)((long)pvVar12 + (long)(int)pfVar11[-2] * 4) *
                                  pfVar11[2] +
                                  *(float *)((long)pvVar12 +
                                            (long)((PreCalc<float> *)(pfVar11 + -4))->pos1 * 4) *
                                  *pfVar11;
                pfVar11 = pfVar11 + 8;
              }
              iVar17 = iVar17 + iVar8;
            }
            fVar24 = 0.0;
            if (fVar30 < fVar32 && fVar28 < fVar29) {
              fVar24 = fVar22 / (float)(iVar7 * iVar6);
            }
            iVar18 = iVar18 + iVar15 * iVar8;
            *(float *)((long)local_160 + lVar13 * 4) = fVar24;
            lVar13 = lVar13 + 1;
            p_Var10 = pp_Var2[-3];
          }
          local_160 = (void *)((long)local_160 +
                              (long)*(int *)(&this->field_0xd0 + (long)p_Var10) * 4);
        }
      }
    }
    std::_Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>::~_Vector_base
              (&pre_calc.
                super__Vector_base<ncnn::PreCalc<float>,_std::allocator<ncnn::PreCalc<float>_>_>);
    iVar18 = 0;
  }
  return iVar18;
}

Assistant:

int ROIAlign_x86::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const int width = bottom_blob.w;
    const int height = bottom_blob.h;
    const size_t elemsize = bottom_blob.elemsize;
    const int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: max pool over R
    const float* roi_ptr = roi_blob;

    float roi_start_w = roi_ptr[0] * spatial_scale;
    float roi_start_h = roi_ptr[1] * spatial_scale;
    float roi_end_w = roi_ptr[2] * spatial_scale;
    float roi_end_h = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_start_w -= 0.5f;
        roi_start_h -= 0.5f;
        roi_end_w -= 0.5f;
        roi_end_h -= 0.5f;
    }

    float roi_width = roi_end_w - roi_start_w;
    float roi_height = roi_end_h - roi_start_h;

    if (!aligned)
    {
        roi_width = std::max(roi_width, 1.f);
        roi_height = std::max(roi_height, 1.f);
    }

    float bin_size_w = (float)roi_width / (float)pooled_width;
    float bin_size_h = (float)roi_height / (float)pooled_height;

    if (version == 0)
    {
        // original version
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));
        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        original_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            sampling_ratio,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_start_h + ph * bin_size_h;
                    float wstart = roi_start_w + pw * bin_size_w;
                    float hend = roi_start_h + (ph + 1) * bin_size_h;
                    float wend = roi_start_w + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)height);
                    wstart = std::min(std::max(wstart, 0.f), (float)width);
                    hend = std::min(std::max(hend, 0.f), (float)height);
                    wend = std::min(std::max(wend, 0.f), (float)width);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];
                            // bilinear interpolate at (x,y)
                            sum += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_height / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_width / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        std::vector<PreCalc<float> > pre_calc(
            (size_t)roi_bin_grid_h * roi_bin_grid_w * pooled_width * pooled_height);
        detectron2_pre_calc_for_bilinear_interpolate(
            height,
            width,
            pooled_height,
            pooled_width,
            roi_bin_grid_h,
            roi_bin_grid_w,
            roi_start_h,
            roi_start_w,
            bin_size_h,
            bin_size_w,
            roi_bin_grid_h,
            roi_bin_grid_w,
            pre_calc);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            int pre_calc_index = 0;

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float output_val = 0.f;
                    for (int iy = 0; iy < roi_bin_grid_h; iy++)
                    {
                        for (int ix = 0; ix < roi_bin_grid_w; ix++)
                        {
                            PreCalc<float>& pc = pre_calc[pre_calc_index++];

                            output_val += pc.w1 * ptr[pc.pos1] + pc.w2 * ptr[pc.pos2] + pc.w3 * ptr[pc.pos3] + pc.w4 * ptr[pc.pos4];
                        }
                    }
                    output_val /= count;
                    outptr[pw] = output_val;
                }
                outptr += pooled_width;
            }
        }
    }

    return 0;
}